

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

vector<slang::BufferID,_std::allocator<slang::BufferID>_> * __thiscall
slang::SourceManager::getAllBuffers
          (vector<slang::BufferID,_std::allocator<slang::BufferID>_> *__return_storage_ptr__,
          SourceManager *this)

{
  iterator __position;
  ulong uVar1;
  BufferID local_2c;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  (__return_storage_ptr__->super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < (ulong)(((long)(this->bufferEntries).
                         super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->bufferEntries).
                         super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7)) {
    uVar1 = 1;
    do {
      local_2c.id = (uint32_t)uVar1;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<slang::BufferID,_std::allocator<slang::BufferID>_>::
        _M_realloc_insert<slang::BufferID>(__return_storage_ptr__,__position,&local_2c);
      }
      else {
        (__position._M_current)->id = local_2c.id;
        (__return_storage_ptr__->
        super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)(((long)(this->bufferEntries).
                                    super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->bufferEntries).
                                    super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7));
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BufferID> SourceManager::getAllBuffers() const {
    std::shared_lock lock(mut);
    std::vector<BufferID> result;
    for (size_t i = 1; i < bufferEntries.size(); i++)
        result.push_back(BufferID((uint32_t)i, ""sv));

    return result;
}